

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall kj::Vector<unsigned_char>::setCapacity(Vector<unsigned_char> *this,size_t newSize)

{
  uchar *puVar1;
  uchar *puVar2;
  RemoveConst<unsigned_char> *pRVar3;
  uchar *__dest;
  size_t __n;
  ArrayBuilder<unsigned_char> newBuilder;
  ArrayBuilder<unsigned_char> local_38;
  
  puVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)puVar1)) {
    (this->builder).pos = puVar1 + newSize;
  }
  __dest = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                              (1,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  puVar1 = (this->builder).ptr;
  puVar2 = (this->builder).pos;
  local_38.ptr = __dest;
  if (puVar1 != puVar2) {
    __n = (long)puVar2 - (long)puVar1;
    local_38.pos = __dest;
    memcpy(__dest,puVar1,__n);
    __dest = __dest + __n;
  }
  local_38.pos = __dest;
  ArrayBuilder<unsigned_char>::operator=(&this->builder,&local_38);
  puVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  puVar1 = local_38.ptr;
  if (local_38.ptr != (uchar *)0x0) {
    local_38.ptr = (uchar *)0x0;
    local_38.pos = (RemoveConst<unsigned_char> *)0x0;
    local_38.endPtr = (uchar *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,puVar1,1,(long)pRVar3 - (long)puVar1,(long)puVar2 - (long)puVar1,0)
    ;
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }